

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ExtensionSet::GetString
          (ExtensionSet *this,int number,string *default_value)

{
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  char *pcVar1;
  LogMessage *pLVar2;
  CppType *v1_00;
  CppType *v2_00;
  LogMessage local_90;
  Voidify local_79;
  CppType local_78;
  CppType local_74;
  Nullable<const_char_*> local_70;
  LogMessage local_58;
  Voidify local_41;
  anon_enum_32 local_40;
  anon_enum_32 local_3c;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  string *default_value_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)default_value;
  default_value_local._4_4_ = number;
  pEStack_18 = this;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)FindOrNull(this,number);
  if (((Extension *)absl_log_internal_check_op_result == (Extension *)0x0) ||
     (((byte)((Extension *)absl_log_internal_check_op_result)->field_0xa >> 1 & 1) != 0)) {
    this_local = (ExtensionSet *)extension;
  }
  else {
    local_3c = (anon_enum_32)
               ((((Extension *)absl_log_internal_check_op_result)->is_repeated & 1U) == 0);
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_3c);
    local_40 = OPTIONAL_FIELD;
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_40);
    local_38 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                         (v1,v2,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
    if (local_38 != (Nullable<const_char_*>)0x0) {
      pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_38);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x247,pcVar1);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    local_74 = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
    v1_00 = absl::lts_20250127::log_internal::
            GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_74);
    local_78 = CPPTYPE_STRING;
    v2_00 = absl::lts_20250127::log_internal::
            GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_78);
    local_70 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (v1_00,v2_00,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_STRING");
    if (local_70 != (Nullable<const_char_*>)0x0) {
      pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x247,pcVar1);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_90);
    }
    this_local = *(ExtensionSet **)absl_log_internal_check_op_result;
  }
  return (string *)this_local;
}

Assistant:

const std::string& ExtensionSet::GetString(
    int number, const std::string& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
    return *extension->ptr.string_value;
  }
}